

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined8 extraout_RAX;
  long *plVar9;
  ulong *puVar10;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  stringstream *ss;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  undefined1 local_228 [8];
  char buffer [256];
  undefined1 local_118 [16];
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  int local_e4;
  string local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  Message error;
  long local_90;
  long lStack_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  stringstream *local_60;
  string local_58;
  byte local_31 [8];
  char flag;
  
LAB_0013493b:
  sVar3 = read(this->read_fd_,local_31,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x00134954;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_00134a44;
  }
  if (iVar2 == 1) {
    if (local_31[0] < 0x52) {
      if (local_31[0] == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message((Message *)&local_a0);
        local_60 = local_a0.ptr_;
        poVar6 = (ostream *)(local_a0.ptr_ + 0x10);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_228,0xff);
            uVar15 = (uint)sVar3;
            if ((int)uVar15 < 1) break;
            buffer[(ulong)(uVar15 & 0x7fffffff) - 8] = '\0';
            sVar7 = strlen(local_228);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_228,sVar7);
          }
        } while ((uVar15 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        ss = local_60;
        if (uVar15 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/build_O1/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                             ,0x150);
          StringStreamToString(&local_58,ss);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          ss = local_60;
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/build_O1/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                             ,0x153);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_58._M_dataplus._M_p,
                              local_58._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        GTestLog::~GTestLog((GTestLog *)&local_80);
        if (ss != (stringstream *)0x0) {
          (**(code **)(*(long *)ss + 8))(ss);
          local_a0.ptr_ = (stringstream *)0x0;
        }
      }
      else {
        if (local_31[0] != 0x4c) goto LAB_00134af2;
        this->outcome_ = LIVED;
      }
    }
    else if (local_31[0] == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_31[0] == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_00134af2:
      GTestLog::GTestLog((GTestLog *)local_228,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/build_O1/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                         ,0x1d1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_228);
    }
    goto LAB_00134a44;
  }
  goto LAB_001349c4;
code_r0x00134954:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_001349c4;
  goto LAB_0013493b;
LAB_001349c4:
  GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/build_O1/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)local_228,buffer._0_8_);
  if (local_228 != (undefined1  [8])(buffer + 8)) {
    operator_delete((void *)local_228,buffer._8_8_ + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_58);
LAB_00134a44:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  buffer._248_8_ = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(buffer + 0xf8),"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append(buffer + 0xf8);
  local_108 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_108 == plVar9) {
    local_f8 = *plVar9;
    lStack_f0 = plVar5[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar9;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_c0 = (ulong *)*plVar5;
  puVar10 = (ulong *)(plVar5 + 2);
  if (local_c0 == puVar10) {
    local_b0 = *puVar10;
    lStack_a8 = plVar5[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar10;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_e4 = 0x1d9;
  StreamableToString<int>(&local_e0,&local_e4);
  uVar13 = 0xf;
  if (local_c0 != &local_b0) {
    uVar13 = local_b0;
  }
  if (uVar13 < local_e0._M_string_length + local_b8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar14 = local_e0.field_2._M_allocated_capacity;
    }
    if (local_e0._M_string_length + local_b8 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_00134e2c;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0._M_dataplus._M_p);
LAB_00134e2c:
  local_80 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_80 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar8[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar1;
  }
  local_78 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5
  ;
  pbVar11 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (local_a0.ptr_ == pbVar11) {
    local_90 = *(long *)pbVar11;
    lStack_88 = plVar5[3];
    local_a0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90;
  }
  else {
    local_90 = *(long *)pbVar11;
  }
  error.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )plVar5[1];
  *plVar5 = (long)pbVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_58._M_dataplus._M_p = (pointer)*plVar5;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_58._M_dataplus._M_p == psVar12) {
    local_58.field_2._M_allocated_capacity = *psVar12;
    local_58.field_2._8_8_ = plVar5[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar12;
  }
  local_58._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_228 = (undefined1  [8])*plVar5;
  plVar9 = plVar5 + 2;
  if (local_228 == (undefined1  [8])plVar9) {
    buffer._8_8_ = *plVar9;
    buffer._16_8_ = plVar5[3];
    local_228 = (undefined1  [8])(buffer + 8);
  }
  else {
    buffer._8_8_ = *plVar9;
  }
  buffer._0_8_ = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DeathTestAbort((string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_80);
  if (local_60 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
    local_a0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}